

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ScatterNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_scatternd(NeuralNetworkLayer *this)

{
  bool bVar1;
  ScatterNDLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_scatternd(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_scatternd(this);
    this_00 = (ScatterNDLayerParams *)operator_new(0x18);
    ScatterNDLayerParams::ScatterNDLayerParams(this_00);
    (this->layer_).scatternd_ = this_00;
  }
  return (ScatterNDLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ScatterNDLayerParams* NeuralNetworkLayer::mutable_scatternd() {
  if (!has_scatternd()) {
    clear_layer();
    set_has_scatternd();
    layer_.scatternd_ = new ::CoreML::Specification::ScatterNDLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.scatterND)
  return layer_.scatternd_;
}